

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<4>::
AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>::
AngularDistributions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_00000084;
  int in_stack_ffffffffffffff70;
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution> local_88;
  
  readInterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_88,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_00000084,MAT),MF,MT,
             in_stack_ffffffffffffff70);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>::
  InterpolationSequenceRecord
            (&this->
              super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
             ,&local_88);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>::
  ~InterpolationSequenceRecord(&local_88);
  return;
}

Assistant:

AngularDistributions( Iterator& begin,
                      const Iterator& end,
                      long& lineNumber,
                      int MAT,
                      int MF,
                      int MT ) :
  InterpolationSequenceRecord< Records >(
    readInterpolationSequenceRecord< Records >( begin, end, lineNumber,
                                                MAT, MF, MT ) ) {}